

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Descriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindAnyType
          (AggregateOptionFinder *this,Message *param_1,string *prefix,string *name)

{
  DescriptorBuilder *this_00;
  string_view name_00;
  bool bVar1;
  Symbol local_38;
  string *local_30;
  string *name_local;
  string *prefix_local;
  Message *param_1_local;
  AggregateOptionFinder *this_local;
  
  local_30 = name;
  name_local = prefix;
  prefix_local = (string *)param_1;
  param_1_local = (Message *)this;
  bVar1 = std::operator!=(prefix,"type.googleapis.com/");
  if ((bVar1) && (bVar1 = std::operator!=(name_local,"type.googleprod.com/"), bVar1)) {
    this_local = (AggregateOptionFinder *)0x0;
  }
  else {
    assert_mutex_held(this->builder_->pool_);
    this_00 = this->builder_;
    name_00 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    local_38 = FindSymbol(this_00,name_00,true);
    this_local = (AggregateOptionFinder *)Symbol::descriptor(&local_38);
  }
  return (Descriptor *)this_local;
}

Assistant:

const Descriptor* FindAnyType(const Message& /*message*/,
                                const std::string& prefix,
                                const std::string& name) const override {
    if (prefix != internal::kTypeGoogleApisComPrefix &&
        prefix != internal::kTypeGoogleProdComPrefix) {
      return nullptr;
    }
    assert_mutex_held(builder_->pool_);
    return builder_->FindSymbol(name).descriptor();
  }